

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PaddingLayerParams_PaddingConstant::~PaddingLayerParams_PaddingConstant
          (PaddingLayerParams_PaddingConstant *this)

{
  PaddingLayerParams_PaddingConstant *this_local;
  
  ~PaddingLayerParams_PaddingConstant(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

PaddingLayerParams_PaddingConstant::~PaddingLayerParams_PaddingConstant() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.PaddingLayerParams.PaddingConstant)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}